

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_parse_url_options(connectdata *conn)

{
  uint uVar1;
  char *first;
  int iVar2;
  char *value_00;
  bool bVar3;
  char *value;
  char *key;
  char *ptr;
  pop3_conn *pop3c;
  CURLcode result;
  connectdata *conn_local;
  
  pop3c._4_4_ = CURLE_OK;
  key = conn->options;
  (conn->proto).ftpc.transfertype = '\x01';
  while( true ) {
    first = key;
    bVar3 = false;
    if ((pop3c._4_4_ == CURLE_OK) && (bVar3 = false, key != (char *)0x0)) {
      bVar3 = *key != '\0';
    }
    if (!bVar3) break;
    while( true ) {
      bVar3 = false;
      if (*key != '\0') {
        bVar3 = *key != '=';
      }
      if (!bVar3) break;
      key = key + 1;
    }
    value_00 = key + 1;
    while( true ) {
      bVar3 = false;
      if (*key != '\0') {
        bVar3 = *key != ';';
      }
      if (!bVar3) break;
      key = key + 1;
    }
    iVar2 = curl_strnequal(first,"AUTH=",5);
    if (iVar2 == 0) {
      pop3c._4_4_ = CURLE_URL_MALFORMAT;
    }
    else {
      pop3c._4_4_ = Curl_sasl_parse_url_auth_option
                              ((SASL *)&(conn->proto).imapc.sasl.prefmech,value_00,
                               (long)key - (long)value_00);
      if ((pop3c._4_4_ != CURLE_OK) &&
         (iVar2 = curl_strnequal(value_00,"+APOP",(long)key - (long)value_00), iVar2 != 0)) {
        (conn->proto).ftpc.count3 = 2;
        (conn->proto).imapc.preftype = 0;
        pop3c._4_4_ = CURLE_OK;
      }
    }
    if (*key == ';') {
      key = key + 1;
    }
  }
  if ((conn->proto).ftpc.count3 != 2) {
    uVar1 = (conn->proto).imapc.preftype;
    if (uVar1 == 0xffffff5f) {
      (conn->proto).ftpc.count3 = -1;
    }
    else if (uVar1 == 0) {
      (conn->proto).ftpc.count3 = 0;
    }
    else {
      (conn->proto).ftpc.count3 = 4;
    }
  }
  return pop3c._4_4_;
}

Assistant:

static CURLcode pop3_parse_url_options(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  const char *ptr = conn->options;

  pop3c->sasl.resetprefs = TRUE;

  while(!result && ptr && *ptr) {
    const char *key = ptr;
    const char *value;

    while(*ptr && *ptr != '=')
        ptr++;

    value = ptr + 1;

    while(*ptr && *ptr != ';')
      ptr++;

    if(strnequal(key, "AUTH=", 5)) {
      result = Curl_sasl_parse_url_auth_option(&pop3c->sasl,
                                               value, ptr - value);

      if(result && strnequal(value, "+APOP", ptr - value)) {
        pop3c->preftype = POP3_TYPE_APOP;
        pop3c->sasl.prefmech = SASL_AUTH_NONE;
        result = CURLE_OK;
      }
    }
    else
      result = CURLE_URL_MALFORMAT;

    if(*ptr == ';')
      ptr++;
  }

  if(pop3c->preftype != POP3_TYPE_APOP)
    switch(pop3c->sasl.prefmech) {
    case SASL_AUTH_NONE:
      pop3c->preftype = POP3_TYPE_NONE;
      break;
    case SASL_AUTH_DEFAULT:
      pop3c->preftype = POP3_TYPE_ANY;
      break;
    default:
      pop3c->preftype = POP3_TYPE_SASL;
      break;
    }

  return result;
}